

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  pointer ppVar6;
  char *ip_00;
  function<void_(int)> local_c8;
  _Self local_a8;
  _Self local_a0;
  const_iterator it;
  string ip;
  function<void_(int)> local_68;
  Error *local_48;
  Error *error_local;
  ClientImpl *this_local;
  
  local_48 = error;
  error_local = (Error *)this;
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) && (this->proxy_port_ != -1)) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar1 = this->address_family_;
    iVar2 = this->proxy_port_;
    bVar3 = this->tcp_nodelay_;
    std::function<void_(int)>::function(&local_68,&this->socket_options_);
    this_local._4_4_ =
         detail::create_client_socket
                   (pcVar5,"",iVar2,iVar1,(bool)(bVar3 & 1),&local_68,this->connection_timeout_sec_,
                    this->connection_timeout_usec_,this->read_timeout_sec_,this->read_timeout_usec_,
                    this->write_timeout_sec_,this->write_timeout_usec_,&this->interface_,local_48);
    std::function<void_(int)>::~function(&local_68);
  }
  else {
    std::__cxx11::string::string((string *)&it);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->addr_map_,&this->host_);
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->addr_map_);
    bVar3 = std::operator!=(&local_a0,&local_a8);
    if (bVar3) {
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_a0);
      std::__cxx11::string::operator=((string *)&it,(string *)&ppVar6->second);
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    ip_00 = (char *)std::__cxx11::string::c_str();
    iVar1 = this->port_;
    iVar2 = this->address_family_;
    bVar3 = this->tcp_nodelay_;
    std::function<void_(int)>::function(&local_c8,&this->socket_options_);
    this_local._4_4_ =
         detail::create_client_socket
                   (pcVar5,ip_00,iVar1,iVar2,(bool)(bVar3 & 1),&local_c8,
                    this->connection_timeout_sec_,this->connection_timeout_usec_,
                    this->read_timeout_sec_,this->read_timeout_usec_,this->write_timeout_sec_,
                    this->write_timeout_usec_,&this->interface_,local_48);
    std::function<void_(int)>::~function(&local_c8);
    std::__cxx11::string::~string((string *)&it);
  }
  return this_local._4_4_;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error &error) const {
  if (!proxy_host_.empty() && proxy_port_ != -1) {
    return detail::create_client_socket(
        proxy_host_.c_str(), "", proxy_port_, address_family_, tcp_nodelay_,
        socket_options_, connection_timeout_sec_, connection_timeout_usec_,
        read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
        write_timeout_usec_, interface_, error);
  }

  // Check is custom IP specified for host_
  std::string ip;
  auto it = addr_map_.find(host_);
  if (it != addr_map_.end()) ip = it->second;

  return detail::create_client_socket(
      host_.c_str(), ip.c_str(), port_, address_family_, tcp_nodelay_,
      socket_options_, connection_timeout_sec_, connection_timeout_usec_,
      read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
      write_timeout_usec_, interface_, error);
}